

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall PrimitiveTestClass::PrintArr<long*>(PrimitiveTestClass *this,long *arr)

{
  ostream *poVar1;
  ulong uVar2;
  
  if (this->SIZE != 0) {
    uVar2 = 0;
    do {
      poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (ulong)(long)this->SIZE);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  return;
}

Assistant:

void PrintArr(T arr)
        {
            for (size_t i = 0; i < SIZE; i++)
            {
                cout << arr[i] << ", ";
            }
            
            cout << endl;
        }